

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNBuilderMBlurSAH<4,_embree::Instance,_embree::InstancePrimitive>::build
          (BVHNBuilderMBlurSAH<4,_embree::Instance,_embree::InstancePrimitive> *this)

{
  Scene *pSVar1;
  GTypeMask GVar2;
  BVHN<4> *this_00;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  size_type *psVar6;
  EVP_PKEY_CTX *ctx;
  double t0;
  string __str;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pSVar1 = this->scene;
  GVar2 = this->gtype_;
  uVar4 = (uint)GVar2;
  if ((uVar4 >> 0x14 & 1) == 0) {
    ctx = (EVP_PKEY_CTX *)0x0;
  }
  else {
    ctx = (EVP_PKEY_CTX *)(pSVar1->world).numMBTriangles;
  }
  if ((uVar4 >> 0x15 & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBQuads;
  }
  if ((GVar2 & MTY_CURVE2) != ~MTY_ALL) {
    ctx = ctx + (pSVar1->world).numMBLineSegments;
  }
  if ((GVar2 & MTY_CURVE4) != ~MTY_ALL) {
    ctx = ctx + (pSVar1->world).numMBBezierCurves;
  }
  if ((GVar2 & MTY_POINTS) != ~MTY_ALL) {
    ctx = ctx + (pSVar1->world).numMBPoints;
  }
  if ((uVar4 >> 0x17 & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBSubdivPatches;
  }
  if ((uVar4 >> 0x1d & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBUserGeometries;
  }
  if ((uVar4 >> 0x1e & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBInstancesCheap;
  }
  if ((int)uVar4 < 0) {
    ctx = ctx + (pSVar1->world).numMBInstancesExpensive;
  }
  if ((uVar4 >> 0x18 & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBInstanceArrays;
  }
  if ((uVar4 >> 0x16 & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBGrids;
  }
  this_00 = this->bvh;
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
    *local_50[0] = 0x34;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1fb0eed);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    t0 = BVHN<4>::preBuild(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    buildMultiSegment(this,(size_t)ctx);
    BVHN<4>::cleanup(this->bvh,ctx);
    BVHN<4>::postBuild(this->bvh,t0);
    return;
  }
  (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
  return;
}

Assistant:

void build()
      {
	/* skip build for empty scene */
        const size_t numPrimitives = scene->getNumPrimitives(gtype_,true);
        if (numPrimitives == 0) { bvh->clear(); return; }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "BuilderMBlurSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif

            //const size_t numTimeSteps = scene->getNumTimeSteps<typename Mesh::type_t,true>();
            //const size_t numTimeSegments = numTimeSteps-1; assert(numTimeSteps > 1);

            /*if (numTimeSegments == 1)
              buildSingleSegment(numPrimitives);
              else*/
              buildMultiSegment(numPrimitives);

#if PROFILE
          });
#endif

	/* clear temporary data for static geometry */
	bvh->cleanup();
        bvh->postBuild(t0);
      }